

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nls.c
# Opt level: O1

int lmdif(custom_funcmult *funcmult,double *x,int M,int N,double *fvec,double *fjac,int ldfjac,
         int maxfev,double *diag,int mode,double factor,int nprint,double eps,double epsfcn,
         double ftol,double gtol,double xtol,int *nfev,int *njev,int *ipvt,double *qtf)

{
  size_t sVar1;
  double dVar2;
  double dVar3;
  double *x_00;
  long lVar4;
  double *pdVar5;
  uint uVar6;
  double *pdVar7;
  long lVar8;
  double *pdVar9;
  int iVar10;
  ulong uVar11;
  double *pdVar12;
  int N_00;
  double *pdVar13;
  double *pdVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  byte bVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double *in_stack_fffffffffffffe38;
  double local_b0;
  double par;
  double *local_a0;
  double *local_98;
  double *local_90;
  double *local_88;
  int local_7c;
  double local_78;
  undefined8 uStack_70;
  uint local_64;
  double *local_60;
  double *local_58;
  double *local_50;
  double local_48;
  double *local_40;
  byte local_31;
  
  pdVar12 = (double *)(ulong)(uint)N;
  local_78 = (double)(long)N;
  sVar1 = (long)local_78 * 8;
  local_98 = fvec;
  local_88 = x;
  local_40 = fjac;
  local_60 = (double *)malloc(sVar1);
  local_58 = (double *)malloc(sVar1);
  x_00 = (double *)malloc(sVar1);
  lVar4 = (long)M;
  local_90 = (double *)malloc(lVar4 * 8);
  pdVar5 = local_98;
  uVar15 = 0;
  uVar6 = 0;
  *nfev = 0;
  *njev = 0;
  if ((((0 < local_78._0_4_) && (N <= M)) && (M <= ldfjac)) &&
     (((uVar15 = uVar6, 0.0 <= ftol && (0.0 <= xtol)) &&
      ((0.0 < factor && ((0 < maxfev && (0.0 <= gtol)))))))) {
    if (0 < N && mode == 2) {
      pdVar7 = (double *)0x0;
      do {
        if (diag[(long)pdVar7] <= 0.0) {
          return 0;
        }
        pdVar7 = (double *)((long)pdVar7 + 1);
      } while (pdVar12 != pdVar7);
    }
    local_78 = (double)CONCAT71(local_78._1_7_,mode == 2);
    local_a0 = pdVar12;
    local_50 = pdVar12;
    (*funcmult->funcmult)(local_88,M,N,local_98,funcmult->params);
    *nfev = 1;
    dVar18 = enorm(pdVar5,M);
    pdVar12 = local_50;
    local_b0 = 0.0;
    sVar1 = (ulong)(uint)M * 8;
    local_31 = N < 1 | local_78._0_1_;
    local_7c = 1;
    pdVar5 = local_88;
    local_64 = M;
    do {
      pdVar14 = local_40;
      uVar15 = local_64;
      pdVar7 = local_a0;
      N_00 = (int)local_a0;
      iVar10 = N_00;
      fdjac2(funcmult,pdVar5,local_64,N_00,local_98,local_40,(int)in_stack_fffffffffffffe38,epsfcn,
             eps);
      *njev = *njev + N_00;
      pdVar9 = (double *)(ulong)uVar15;
      qrfac(pdVar14,uVar15,N_00,iVar10,1,ipvt,(int)in_stack_fffffffffffffe38,local_60,local_58,eps);
      if (local_7c == 1) {
        if (local_31 == 0) {
          pdVar5 = (double *)0x0;
          do {
            uVar17 = -(ulong)(local_58[(long)pdVar5] == 0.0);
            diag[(long)pdVar5] =
                 (double)(uVar17 & 0x3ff0000000000000 | ~uVar17 & (ulong)local_58[(long)pdVar5]);
            pdVar5 = (double *)((long)pdVar5 + 1);
          } while (local_50 != pdVar5);
        }
        if (0 < N_00) {
          pdVar5 = (double *)0x0;
          do {
            x_00[(long)pdVar5] = diag[(long)pdVar5] * local_88[(long)pdVar5];
            pdVar5 = (double *)((long)pdVar5 + 1);
          } while (local_50 != pdVar5);
        }
        pdVar9 = (double *)((ulong)pdVar7 & 0xffffffff);
        par = enorm(x_00,N_00);
        local_48 = par * factor;
        if ((local_48 == 0.0) && (!NAN(local_48))) {
          local_48 = factor;
        }
      }
      if (0 < (int)local_64) {
        pdVar9 = local_98;
        memcpy(local_90,local_98,sVar1);
      }
      if (0 < N_00) {
        pdVar9 = (double *)0x0;
        uVar17 = (ulong)(uint)M;
        pdVar5 = local_90;
        pdVar7 = local_40;
        do {
          iVar10 = (N + 1) * (int)pdVar9;
          dVar24 = local_40[iVar10];
          if ((dVar24 != 0.0) || (NAN(dVar24))) {
            dVar23 = 0.0;
            if ((long)pdVar9 < lVar4) {
              uVar11 = 0;
              pdVar14 = pdVar7;
              do {
                dVar23 = dVar23 + *pdVar14 * pdVar5[uVar11];
                pdVar14 = pdVar14 + (long)pdVar12;
                uVar11 = uVar11 + 1;
              } while (uVar17 != uVar11);
            }
            local_78 = -dVar23 / dVar24;
            uStack_70 = 0x8000000000000000;
            if ((long)pdVar9 < lVar4) {
              uVar11 = 0;
              pdVar14 = pdVar7;
              do {
                pdVar5[uVar11] = *pdVar14 * local_78 + pdVar5[uVar11];
                pdVar14 = pdVar14 + (long)pdVar12;
                uVar11 = uVar11 + 1;
              } while (uVar17 != uVar11);
            }
          }
          local_40[iVar10] = local_60[(long)pdVar9];
          qtf[(long)pdVar9] = local_90[(long)pdVar9];
          pdVar9 = (double *)((long)pdVar9 + 1);
          pdVar7 = pdVar7 + (long)pdVar12 + 1;
          pdVar5 = pdVar5 + 1;
          uVar17 = uVar17 - 1;
        } while (pdVar9 != local_50);
      }
      dVar24 = 0.0;
      pdVar5 = local_58;
      if (dVar18 != 0.0 && 0 < N_00) {
        lVar16 = 1;
        pdVar13 = (double *)0x0;
        pdVar7 = local_50;
        pdVar14 = local_40;
        do {
          dVar23 = pdVar5[ipvt[(long)pdVar13]];
          if ((dVar23 != 0.0) || (NAN(dVar23))) {
            dVar22 = 0.0;
            lVar8 = 0;
            pdVar5 = pdVar14;
            do {
              dVar22 = dVar22 + (qtf[lVar8] / dVar18) * *pdVar5;
              lVar8 = lVar8 + 1;
              pdVar5 = pdVar5 + (long)pdVar12;
            } while (lVar16 != lVar8);
            dVar24 = pmax(dVar24,ABS(dVar22 / dVar23));
            pdVar5 = local_58;
            pdVar7 = local_50;
          }
          pdVar13 = (double *)((long)pdVar13 + 1);
          lVar16 = lVar16 + 1;
          pdVar14 = pdVar14 + 1;
        } while (pdVar13 != pdVar7);
      }
      pdVar7 = local_90;
      if (dVar24 <= gtol) {
        uVar15 = 4;
        break;
      }
      if (local_31 == 0) {
        pdVar14 = (double *)0x0;
        do {
          dVar23 = pmax(diag[(long)pdVar14],pdVar5[(long)pdVar14]);
          diag[(long)pdVar14] = dVar23;
          pdVar14 = (double *)((long)pdVar14 + 1);
        } while (local_50 != pdVar14);
      }
      dVar23 = 0.0;
      pdVar5 = local_88;
      do {
        pdVar14 = local_58;
        if (0.0001 <= dVar23) {
          uVar15 = 0;
          break;
        }
        in_stack_fffffffffffffe38 = &local_b0;
        iVar10 = (int)local_a0;
        lmpar(local_40,(int)pdVar9,iVar10,ipvt,diag,qtf,local_48,in_stack_fffffffffffffe38,local_60,
              local_58);
        if (0 < iVar10) {
          pdVar7 = (double *)0x0;
          do {
            dVar23 = local_60[(long)pdVar7];
            dVar22 = -dVar23;
            local_60[(long)pdVar7] = dVar22;
            pdVar14[(long)pdVar7] = pdVar5[(long)pdVar7] - dVar23;
            x_00[(long)pdVar7] = diag[(long)pdVar7] * dVar22;
            pdVar7 = (double *)((long)pdVar7 + 1);
          } while (local_50 != pdVar7);
        }
        dVar22 = enorm(x_00,iVar10);
        pdVar7 = local_90;
        if (local_7c == 1) {
          local_48 = pmin(local_48,dVar22);
        }
        uVar15 = local_64;
        (*funcmult->funcmult)(local_58,local_64,iVar10,pdVar7,funcmult->params);
        *nfev = *nfev + 1;
        dVar19 = enorm(pdVar7,uVar15);
        if (0 < iVar10) {
          lVar16 = 1;
          pdVar14 = (double *)0x0;
          pdVar5 = local_40;
          do {
            x_00[(long)pdVar14] = 0.0;
            local_78 = local_60[ipvt[(long)pdVar14]];
            uStack_70 = 0;
            lVar8 = 0;
            pdVar9 = pdVar5;
            do {
              x_00[lVar8] = *pdVar9 * local_78 + x_00[lVar8];
              lVar8 = lVar8 + 1;
              pdVar9 = pdVar9 + (long)pdVar12;
            } while (lVar16 != lVar8);
            pdVar14 = (double *)((long)pdVar14 + 1);
            lVar16 = lVar16 + 1;
            pdVar5 = pdVar5 + 1;
          } while (pdVar14 != local_50);
        }
        dVar23 = enorm(x_00,iVar10);
        dVar3 = local_b0;
        if (local_b0 < 0.0) {
          dVar20 = sqrt(local_b0);
        }
        else {
          dVar20 = SQRT(local_b0);
        }
        pdVar5 = local_88;
        dVar26 = 1.0 - (dVar19 / dVar18) * (dVar19 / dVar18);
        uVar17 = -(ulong)(dVar19 * 0.1 < dVar18);
        dVar2 = (double)(~uVar17 & 0xbff0000000000000 | uVar17 & (ulong)dVar26);
        dVar20 = (dVar20 * dVar22) / dVar18;
        dVar20 = dVar20 * dVar20;
        dVar27 = (dVar23 / dVar18) * (dVar23 / dVar18);
        dVar25 = dVar20 + dVar20 + dVar27;
        dVar23 = (double)(-(ulong)(dVar25 != 0.0) & (ulong)(dVar2 / dVar25));
        if (dVar23 <= 0.25) {
          dVar27 = dVar27 + dVar20;
          dVar20 = (double)(~-(ulong)(dVar2 < 0.0) &
                            (~-(ulong)(dVar2 < 0.0) & 0x3fe0000000000000 |
                            (ulong)local_78 & -(ulong)(dVar2 < 0.0)) |
                           (ulong)((dVar27 * -0.5) / (dVar2 * 0.5 - dVar27)) & -(ulong)(dVar2 < 0.0)
                           );
          local_78 = 0.1;
          if (dVar19 * 0.1 < dVar18 && 0.1 <= dVar20) {
            local_78 = dVar20;
          }
          uStack_70 = 0;
          local_48 = pmin(local_48,dVar22 / 0.1);
          local_48 = local_48 * local_78;
          local_b0 = dVar3 / local_78;
        }
        else if (((dVar3 == 0.0) && (!NAN(dVar3))) || (0.75 <= dVar23)) {
          local_48 = dVar22 + dVar22;
          local_b0 = dVar3 * 0.5;
        }
        if (0.0001 <= dVar23) {
          if (0 < iVar10) {
            pdVar14 = (double *)0x0;
            do {
              dVar18 = local_58[(long)pdVar14];
              pdVar5[(long)pdVar14] = dVar18;
              local_58[(long)pdVar14] = dVar18 * diag[(long)pdVar14];
              pdVar14 = (double *)((long)pdVar14 + 1);
            } while (local_50 != pdVar14);
          }
          if (0 < (int)local_64) {
            memcpy(local_98,pdVar7,sVar1);
          }
          par = enorm(local_58,iVar10);
          local_7c = local_7c + 1;
          dVar18 = dVar19;
        }
        dVar19 = (double)(~uVar17 & 0x3ff0000000000000 | (ulong)ABS(dVar26) & uVar17);
        bVar21 = -(ftol < dVar25) | -(ftol < dVar19);
        dVar22 = dVar23 * 0.5;
        uVar6 = (uint)(~bVar21 & dVar22 <= 1.0);
        uVar15 = uVar6;
        if (local_48 <= par * xtol) {
          uVar6 = 2;
          uVar15 = dVar22 <= 1.0 | 2;
        }
        if ((bVar21 & 1) != 0) {
          uVar15 = uVar6;
        }
        if (uVar15 != 0) break;
        pdVar9 = (double *)(ulong)(uint)maxfev;
        uVar6 = (uint)(maxfev <= *nfev) * 5;
        uVar15 = 6;
        if (1.0 < dVar22) {
          uVar15 = uVar6;
        }
        if (eps < dVar25) {
          uVar15 = uVar6;
        }
        if (eps < dVar19) {
          uVar15 = uVar6;
        }
        if (local_48 <= par * eps) {
          uVar15 = 7;
        }
        if (dVar24 <= eps) {
          uVar15 = 8;
        }
      } while (uVar15 == 0);
    } while (uVar15 == 0);
    free(local_60);
    free(local_58);
    free(x_00);
    free(pdVar7);
  }
  return uVar15;
}

Assistant:

int lmdif(custom_funcmult *funcmult, double *x, int M, int N, double *fvec, double *fjac, int ldfjac,
		int maxfev,double *diag,int mode,double factor,int nprint,double eps,double epsfcn,double ftol,double gtol,
		double xtol,int *nfev,int *njev,int *ipvt, double *qtf) {
	int info;
	int i,j,l,iter;
    double actred,delta,dirder,epsmch,fnorm,fnorm1,gnorm,one,par,pnorm,prered,p1,p5,p25,p75,p0001,ratio,
    sum,temp,temp1,temp2,xnorm,zero;
    double *wa1,*wa2,*wa3,*wa4;

    /*
     * 	*   This routine is a C translation of Fortran Code by
    *     argonne national laboratory. minpack project. march 1980.
     	  burton s. garbow, kenneth e. hillstrom, jorge j. more
     *  M is a positive integer input variable set to the number
c         of functions.
c
c       N is a positive integer input variable set to the number
c         of variables. N must not exceed M.
c
c       x is an array of length N. on input x must contain
c         an initial estimate of the solution vector. on output x
c         contains the final estimate of the solution vector.
c
c       fvec is an output array of length M which contains
c         the functions evaluated at the output x.
c
c       fjac is an output M by N array. the upper N by N submatrix
c         of fjac contains an upper triangular matrix r with
c         diagonal elements of nonincreasing magnitude such that
c
c                t     t           t
c               p *(jac *jac)*p = r *r,
c
c         where p is a permutation matrix and jac is the final
c         calculated jacobian. column j of p is column ipvt(j)
c         (see below) of the identity matrix. the lower trapezoidal
c         part of fjac contains information generated during
c         the computation of r.
c
c       ldfjac is a positive integer input variable not less than M
c         which specifies the leading dimension of the array fjac.
c
c       ftol is a nonnegative input variable. termination
c         occurs when both the actual and predicted relative
c         reductions in the sum of squares are at most ftol.
c         therefore, ftol measures the relative error desired
c         in the sum of squares.
c
c       xtol is a nonnegative input variable. termination
c         occurs when the relative error between two consecutive
c         iterates is at most xtol. therefore, xtol measures the
c         relative error desired in the approximate solution.
c
c       gtol is a nonnegative input variable. termination
c         occurs when the cosine of the angle between fvec and
c         any column of the jacobian is at most gtol in absolute
c         value. therefore, gtol measures the orthogonality
c         desired between the function vector and the columns
c         of the jacobian.
c
c       maxfev is a positive integer input variable. termination
c         occurs when the number of calls to fcn with iflag = 1
c         has reached maxfev.
c
c       epsfcn is an input variable used in determining a suitable
c         step length for the forward-difference approximation. this
c         approximation assumes that the relative errors in the
c         functions are of the order of epsfcn. if epsfcn is less
c         than the machine precision, it is assumed that the relative
c         errors in the functions are of the order of the machine
c         precision.
c
c       diag is an array of length N. if mode = 1 (see
c         below), diag is internally set. if mode = 2, diag
c         must contain positive entries that serve as
c         multiplicative scale factors for the variables.
c
c       mode is an integer input variable. if mode = 1, the
c         variables will be scaled internally. if mode = 2,
c         the scaling is specified by the input diag. other
c         values of mode are equivalent to mode = 1.
c
c       factor is a positive input variable used in determining the
c         initial step bound. this bound is set to the product of
c         factor and the euclidean norm of diag*x if nonzero, or else
c         to factor itself. in most cases factor should lie in the
c         interval (.1,100.).100. is a generally recommended value.
c
c       nprint is an integer input variable that enables controlled
c         printing of iterates if it is positive. in this case,
c         fcn is called with iflag = 0 at the beginning of the first
c         iteration and every nprint iterations thereafter and
c         immediately prior to return, with x, fvec, and fjac
c         available for printing. fvec and fjac should not be
c         altered. if nprint is not positive, no special calls
c         of fcn with iflag = 0 are made.
c
c       info is an integer output variable. if the user has
c         terminated execution, info is set to the (negative)
c         value of iflag. see description of fcn. otherwise,
c         info is set as follows.
c
c         info = 0  improper input parameters.
c
c         info = 1  both actual and predicted relative reductions
c                   in the sum of squares are at most ftol.
c
c         info = 2  relative error between two consecutive iterates
c                   is at most xtol.
c
c         info = 3  conditions for info = 1 and info = 2 both hold.
c
c         info = 4  the cosine of the angle between fvec and any
c                   column of the jacobian is at most gtol in
c                   absolute value.
c
c         info = 5  number of calls to fcn with iflag = 1 has
c                   reached maxfev.
c
c         info = 6  ftol is too small. no further reduction in
c                   the sum of squares is possible.
c
c         info = 7  xtol is too small. no further improvement in
c                   the approximate solution x is possible.
c
c         info = 8  gtol is too small. fvec is orthogonal to the
c                   columns of the jacobian to machine precision.
c
c       nfev is an integer output variable set to the number of
c         calls to fcn with iflag = 1.
c
c       njev is an integer output variable set to the number of
c         calls to fcn with iflag = 2.
c
c       ipvt is an integer output array of length N. ipvt
c         defines a permutation matrix p such that jac*p = q*r,
c         where jac is the final calculated jacobian, q is
c         orthogonal (not stored), and r is upper triangular
c         with diagonal elements of nonincreasing magnitude.
c         column j of p is column ipvt(j) of the identity matrix.
c
c       qtf is an output array of length N which contains
c         the first n elements of the vector (q transpose)*fvec.
     */

	wa1 = (double*) malloc(sizeof(double) *N);
	wa2 = (double*) malloc(sizeof(double) *N);
	wa3 = (double*) malloc(sizeof(double) *N);
	wa4 = (double*) malloc(sizeof(double) *M);

    one = 1.0;
    zero = 0.0;
    p1 = 1.0e-1; p5 = 5.0e-1; p25 = 2.5e-1; p75 = 7.5e-1; p0001 = 1.0e-4;
    epsmch = eps;

    info = 0;
    *nfev = 0;
    *njev = 0;

    if (N <= 0 || M < N || ldfjac < M || ftol < zero || xtol < zero || gtol < zero || maxfev <= 0 || factor <= zero) {
    	return info;
    }

    if (mode == 2) {
		for(j = 0; j < N;++j) {
			if (diag[j] <= 0.0) {
				return info;
			}
		}
    }

    //     evaluate the function at the starting point
    //     and calculate its norm.

    FUNCMULT_EVAL(funcmult,x,M,N,fvec);
    *nfev= 1;
    fnorm = enorm(fvec,M);

    //     initialize levenberg-marquardt parameter and iteration counter.
    par = zero;
    iter = 1;
    ratio = zero;

    //     beginning of the outer loop.

    while(1) {
    	//        calculate the jacobian matrix.
    	ratio = zero;
    	fdjac2(funcmult,x,M,N,fvec,fjac,ldfjac,epsfcn,epsmch);
    	*njev = *njev + N;

    	//        compute the qr factorization of the jacobian.

    	qrfac(fjac,M,N,ldfjac,1,ipvt,N,wa1,wa2,eps);

    	//        on the first iteration and if mode is 1, scale according
    	//        to the norms of the columns of the initial jacobian.

    	if (iter == 1) {//80
    		if (mode != 2) {//60
    			for(j = 0;j < N;++j) {
    				diag[j] = wa2[j];
    				if (wa2[j] == zero) {
    					diag[j] = one;
    				}
    			}
    		}//60

    		//        on the first iteration, calculate the norm of the scaled x
    		//        and initialize the step bound delta.

    		for(j = 0; j < N;++j) {
    			wa3[j] = diag[j]*x[j];
    		}
            xnorm = enorm(wa3,N);
            delta = factor*xnorm;

            if (delta == zero) {
            	delta = factor;
            }

    	}//80

        //        form (q transpose)*fvec and store the first n components in
        //        qtf.

    	for(i = 0; i < M;++i) {
    		wa4[i] = fvec[i];
    	}

    	for(j = 0; j < N;++j) {//130
    		if (fjac[j*N+j] != zero) {//120
    			sum = zero;
    			for(i = j; i < M;++i) {//100
    				sum = sum + fjac[i*N+j]*wa4[i];
    			}//100
    			temp = -sum/fjac[j*N+j];
    			for(i = j; i < M;++i) {//110
    				wa4[i] = wa4[i] + fjac[i*N+j]*temp;
    			}//110
    		}//120
            fjac[j*N+j] = wa1[j];
            qtf[j] = wa4[j];
    	}//130

    	//        compute the norm of the scaled gradient.
    	gnorm = zero;

    	if (fnorm != zero) {//170
    		for(j = 0; j < N;++j) {//160
    			l = ipvt[j];
    			if (wa2[l] != zero) {//150
    				sum = zero;
    				for(i = 0; i <= j;++i) { //140
    					sum = sum + fjac[i*N+j]*(qtf[i]/fnorm);
    				}//140
    				gnorm = pmax(gnorm,fabs(sum/wa2[l]));
    			}//150
    		}//160
    	}//170

    	//        test for convergence of the gradient norm.
    	if (gnorm <= gtol) {
    		info = 4;
    	}
    	if (info != 0) {
    		break;
    	}

    	//        rescale if necessary.
    	if (mode != 2) { //190
    		for(j = 0; j < N;++j) {
    			diag[j] = pmax(diag[j],wa2[j]);
    		}
    	}//190

    	//        beginning of the inner loop.

    	while(ratio < p0001) {
    		//           determine the levenberg-marquardt parameter.
    		lmpar(fjac,ldfjac,N,ipvt,diag,qtf,delta,&par,wa1,wa2);
    		//           store the direction p and x + p. calculate the norm of p.
    		for(j = 0; j < N;++j) {
                wa1[j] = -wa1[j];
                wa2[j] = x[j] + wa1[j];
                wa3[j] = diag[j]*wa1[j];
    		}
			
    		pnorm = enorm(wa3,N);
    		//           on the first iteration, adjust the initial step bound.
    		if (iter == 1) {
    			delta = pmin(delta,pnorm);
    		}
    		//           evaluate the function at x + p and calculate its norm.

    		FUNCMULT_EVAL(funcmult,wa2,M,N,wa4);
    		*nfev = *nfev + 1;
    		fnorm1 = enorm(wa4,M);

    		//           compute the scaled actual reduction.

            actred = -one;
            if (p1*fnorm1 < fnorm) {
            	actred = one - (fnorm1/fnorm)*(fnorm1/fnorm);
            }

            //           compute the scaled predicted reduction and
            //           the scaled directional derivative.

            for(j = 0; j < N;++j) {
                wa3[j] = zero;
                l = ipvt[j];
                temp = wa1[l];
                for(i = 0;i <= j;++i) {
                	wa3[i] = wa3[i] + fjac[i*N+j]*temp;
                }
            }

            temp1 = enorm(wa3,N);
            temp1 = temp1/fnorm;
            temp2 = (sqrt(par)*pnorm)/fnorm;
            prered = temp1*temp1 + temp2*temp2/p5;
            dirder = -(temp1*temp1 + temp2*temp2);
            //           compute the ratio of the actual to the predicted
            //           reduction.
            ratio = zero;
            if (prered != zero) {
            	ratio = actred/prered;
            }
            //           update the step bound.
			

            if (ratio <= p25) {//240
            	if (actred >= zero) {
            		temp = p5;
            	}
            	if (actred < zero) {
            		temp = p5*dirder/(dirder + p5*actred);
            	}
            	if (p1*fnorm1 >= fnorm || temp < p1) {
            		temp = p1;
            	}
                delta = temp*pmin(delta,pnorm/p1);
                par = par/temp;
            } else if (par == zero || ratio >= p75){//240 - 260
                delta = pnorm/p5;
                par = p5*par;
            }//260

            //           test for successful iteration.

            if (ratio >= p0001) {//290
            	//           successful iteration. update x, fvec, and their norms.
            	for(j = 0; j < N;++j) {
                    x[j] = wa2[j];
                    wa2[j] = diag[j]*x[j];
            	}
            	for(i = 0; i < M;++i) {
            		fvec[i] = wa4[i];
            	}
                xnorm = enorm(wa2,N);
                fnorm = fnorm1;
                iter = iter + 1;
            }//290
            //           tests for convergence.
            if ((fabs(actred) <= ftol) && (prered <= ftol) && (p5*ratio <= one)) {
            	info = 1;
            }
            if (delta <= xtol*xnorm) {
            	info = 2;
            }
            if ((fabs(actred) <= ftol) && (prered <= ftol) && (p5*ratio <= one) && (info == 2)) {
            	info = 3;
            }
            if (info != 0) {
            	break;
            }

            //           tests for termination and stringent tolerances.
            if (*nfev >= maxfev) {
            	info = 5;
            }
            if ((fabs(actred) <= epsmch) && (prered <= epsmch) && (p5*ratio <= one)) {
            	info = 6;
            }
            if (delta <= epsmch*xnorm) {
            	info = 7;
            }
            if (gnorm <= epsmch) {
            	info = 8;
            }
            if (info != 0) {
            	break;
            }

    	}

        if (info != 0) {
        	break;
        }


    }


    free(wa1);
    free(wa2);
    free(wa3);
    free(wa4);

	return info;
}